

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O0

int sock_make_blocking(SOCKET sock)

{
  uint uVar1;
  int iVar2;
  int val;
  SOCKET sock_local;
  
  uVar1 = fcntl(sock,3,0);
  iVar2 = fcntl(sock,4,(ulong)(uVar1 & 0xfffff7ff));
  if (iVar2 == -1) {
    val = -1;
  }
  else {
    val = 0;
  }
  return val;
}

Assistant:

int sock_make_blocking(SOCKET sock)
{
#ifdef _WIN32
	u_long val = 0;
	return ioctlsocket(sock, FIONBIO, &val);
#else
	int val;

	val = fcntl(sock, F_GETFL, 0);
	if (fcntl(sock, F_SETFL, val & ~O_NONBLOCK) == -1) {
		return -1;
	}
#endif
	return 0;
}